

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent_inlines.h
# Opt level: O0

void extent_init(extent_t *extent,arena_t *arena,void *addr,size_t size,_Bool slab,szind_t szind,
                size_t sn,extent_state_t state,_Bool zeroed,_Bool committed,_Bool dumpable)

{
  extent_t *in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  extent_t *in_RDI;
  byte in_R8B;
  szind_t in_R9D;
  size_t in_stack_00000008;
  extent_state_t in_stack_00000010;
  arena_t *in_stack_ffffffffffffffb8;
  
  extent_arena_set(in_RCX,in_stack_ffffffffffffffb8);
  extent_addr_set(in_RDI,(void *)CONCAT71(in_register_00000011,in_DL));
  extent_size_set(in_RDI,(size_t)in_RCX);
  extent_slab_set(in_RDI,(_Bool)(in_R8B & 1));
  extent_szind_set(in_RDI,in_R9D);
  extent_sn_set(in_RDI,in_stack_00000008);
  extent_state_set(in_RDI,in_stack_00000010);
  extent_zeroed_set(in_RDI,(_Bool)((byte)szind & 1));
  extent_committed_set(in_RDI,(_Bool)((byte)size & 1));
  extent_dumpable_set(in_RDI,(_Bool)((byte)addr & 1));
  (in_RDI->ql_link).qre_next = in_RDI;
  (in_RDI->ql_link).qre_prev = in_RDI;
  return;
}

Assistant:

static inline void
extent_init(extent_t *extent, arena_t *arena, void *addr, size_t size,
    bool slab, szind_t szind, size_t sn, extent_state_t state, bool zeroed,
    bool committed, bool dumpable) {
	assert(addr == PAGE_ADDR2BASE(addr) || !slab);

	extent_arena_set(extent, arena);
	extent_addr_set(extent, addr);
	extent_size_set(extent, size);
	extent_slab_set(extent, slab);
	extent_szind_set(extent, szind);
	extent_sn_set(extent, sn);
	extent_state_set(extent, state);
	extent_zeroed_set(extent, zeroed);
	extent_committed_set(extent, committed);
	extent_dumpable_set(extent, dumpable);
	ql_elm_new(extent, ql_link);
	if (config_prof) {
		extent_prof_tctx_set(extent, NULL);
	}
}